

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O3

void __thiscall
pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
::maybe(maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
        *this,maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
              *other)

{
  size_type *psVar1;
  anon_struct_8_0_00000001_for___align aVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  
  this->valid_ = false;
  if (other->valid_ == true) {
    pbVar4 = operator->(other);
    psVar1 = (size_type *)((long)&this->storage_ + 0x10);
    *(size_type **)&this->storage_ = psVar1;
    aVar2 = (anon_struct_8_0_00000001_for___align)(pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if (aVar2 == (anon_struct_8_0_00000001_for___align)paVar5) {
      uVar3 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      *psVar1 = paVar5->_M_allocated_capacity;
      *(undefined8 *)((long)&this->storage_ + 0x18) = uVar3;
    }
    else {
      (this->storage_).__align = aVar2;
      *(size_type *)((long)&this->storage_ + 0x10) = paVar5->_M_allocated_capacity;
    }
    *(size_type *)((long)&this->storage_ + 8) = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    this->valid_ = true;
  }
  return;
}

Assistant:

maybe (maybe && other) noexcept (std::is_nothrow_move_constructible<T>::value) {
            if (other.valid_) {
                new (&storage_) T (std::move (*other));
                valid_ = true;
            }
        }